

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd.c
# Opt level: O1

gdImagePtr gdImageCreateFromGdCtx(gdIOCtxPtr in)

{
  int iVar1;
  gdImagePtr im;
  long lVar2;
  long lVar3;
  int gd2xFlag;
  bool bVar4;
  int sx;
  int sy;
  int pix;
  uint local_3c;
  int local_38;
  int local_34;
  
  iVar1 = gdGetWord((int *)&local_3c,in);
  gd2xFlag = 0;
  if (iVar1 != 0) {
    bVar4 = false;
    if ((local_3c & 0xfffffffe) == 0xfffe) {
      bVar4 = local_3c == 0xfffe;
      iVar1 = gdGetWord((int *)&local_3c,in);
      if (iVar1 == 0) goto LAB_0011573b;
      gd2xFlag = 1;
    }
    iVar1 = gdGetWord(&local_38,in);
    if (iVar1 != 0) {
      if (bVar4) {
        im = gdImageCreateTrueColor(local_3c,local_38);
      }
      else {
        im = gdImageCreate(local_3c,local_38);
      }
      if (im != (gdImagePtr)0x0) {
        iVar1 = _gdGetColors(in,im,gd2xFlag);
        if (iVar1 != 0) goto LAB_0011573e;
        gdImageDestroy(im);
      }
    }
  }
LAB_0011573b:
  im = (gdImagePtr)0x0;
LAB_0011573e:
  if (im == (gdImagePtr)0x0) {
    return (gdImagePtr)0x0;
  }
  if (im->trueColor != 0) {
    if (local_38 < 1) {
      return im;
    }
    lVar2 = 0;
    do {
      if (0 < (int)local_3c) {
        lVar3 = 0;
        do {
          iVar1 = gdGetInt(&local_34,in);
          if (iVar1 == 0) {
            iVar1 = 9;
          }
          else {
            im->tpixels[lVar2][lVar3] = local_34;
            iVar1 = 0;
          }
          if (iVar1 != 0) {
LAB_0011580c:
            if (iVar1 == 9) {
              gdImageDestroy(im);
              return (gdImagePtr)0x0;
            }
            return im;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (int)local_3c);
      }
      lVar2 = lVar2 + 1;
      if (local_38 <= lVar2) {
        return im;
      }
    } while( true );
  }
  if (local_38 < 1) {
    return im;
  }
  lVar2 = 0;
  do {
    if (0 < (int)local_3c) {
      lVar3 = 0;
      do {
        iVar1 = gdGetC(in);
        if (iVar1 == -1) {
          iVar1 = 9;
        }
        else {
          im->pixels[lVar2][lVar3] = (uchar)iVar1;
          iVar1 = 0;
        }
        if (iVar1 != 0) goto LAB_0011580c;
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)local_3c);
    }
    lVar2 = lVar2 + 1;
    if (local_38 <= lVar2) {
      return im;
    }
  } while( true );
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGdCtx (gdIOCtxPtr in)
{
	int sx, sy;
	int x, y;
	gdImagePtr im;

	/* Read the header */
	im = _gdCreateFromFile (in, &sx, &sy);

	if (im == NULL) {
		goto fail1;
	};

	/* Then the data... */
	/* 2.0.12: support truecolor properly in .gd as well as in .gd2.
	   Problem reported by Andreas Pfaller. */
	if (im->trueColor) {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int pix;
				if (!gdGetInt (&pix, in)) {
					goto fail2;
				}
				im->tpixels[y][x] = pix;
			}
		}
	} else {
		for (y = 0; (y < sy); y++) {
			for (x = 0; (x < sx); x++) {
				int ch;
				ch = gdGetC (in);
				if (ch == EOF) {
					goto fail2;
				}
				/* ROW-MAJOR IN GD 1.3 */
				im->pixels[y][x] = ch;
			}
		}
	}
	return im;

fail2:
	gdImageDestroy (im);
fail1:
	return 0;
}